

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::DecimalQuantity::ensureCapacity(DecimalQuantity *this,int32_t capacity)

{
  int8_t *piVar1;
  int local_2c;
  int8_t *bcd1;
  int32_t oldCapacity;
  int32_t capacity_local;
  DecimalQuantity *this_local;
  
  if (capacity != 0) {
    if ((this->usingBytes & 1U) == 0) {
      local_2c = 0;
    }
    else {
      local_2c = (this->fBCD).bcdBytes.len;
    }
    if ((this->usingBytes & 1U) == 0) {
      piVar1 = (int8_t *)uprv_malloc_63((long)capacity);
      (this->fBCD).bcdBytes.ptr = piVar1;
      (this->fBCD).bcdBytes.len = capacity;
      memset((this->fBCD).bcdBytes.ptr,0,(long)capacity);
    }
    else if (local_2c < capacity) {
      piVar1 = (int8_t *)uprv_malloc_63((long)(capacity << 1));
      memcpy(piVar1,(this->fBCD).bcdBytes.ptr,(long)local_2c);
      memset(piVar1 + local_2c,0,(long)(capacity - local_2c));
      uprv_free_63((this->fBCD).bcdBytes.ptr);
      (this->fBCD).bcdBytes.ptr = piVar1;
      (this->fBCD).bcdBytes.len = capacity << 1;
    }
    this->usingBytes = true;
  }
  return;
}

Assistant:

void DecimalQuantity::ensureCapacity(int32_t capacity) {
    if (capacity == 0) { return; }
    int32_t oldCapacity = usingBytes ? fBCD.bcdBytes.len : 0;
    if (!usingBytes) {
        // TODO: There is nothing being done to check for memory allocation failures.
        // TODO: Consider indexing by nybbles instead of bytes in C++, so that we can
        // make these arrays half the size.
        fBCD.bcdBytes.ptr = static_cast<int8_t*>(uprv_malloc(capacity * sizeof(int8_t)));
        fBCD.bcdBytes.len = capacity;
        // Initialize the byte array to zeros (this is done automatically in Java)
        uprv_memset(fBCD.bcdBytes.ptr, 0, capacity * sizeof(int8_t));
    } else if (oldCapacity < capacity) {
        auto bcd1 = static_cast<int8_t*>(uprv_malloc(capacity * 2 * sizeof(int8_t)));
        uprv_memcpy(bcd1, fBCD.bcdBytes.ptr, oldCapacity * sizeof(int8_t));
        // Initialize the rest of the byte array to zeros (this is done automatically in Java)
        uprv_memset(bcd1 + oldCapacity, 0, (capacity - oldCapacity) * sizeof(int8_t));
        uprv_free(fBCD.bcdBytes.ptr);
        fBCD.bcdBytes.ptr = bcd1;
        fBCD.bcdBytes.len = capacity * 2;
    }
    usingBytes = true;
}